

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O3

void __thiscall
lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::
write_variable_assignment
          (Code_writing_state *this,ostream *os,string *variable,Expression_node *value)

{
  ostream *poVar1;
  mapped_type *this_00;
  string *psVar2;
  Expression_node *local_20;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(this->options).indent._M_dataplus._M_p,
                      (this->options).indent._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(variable->_M_dataplus)._M_p,variable->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  local_20 = value;
  this_00 = std::__detail::
            _Map_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>,_std::allocator<std::pair<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*const,_lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::State>_>,_std::__detail::_Select1st,_std::equal_to<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::hash<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->states,&local_20);
  psVar2 = State::get_variable_name_abi_cxx11_(this_00,value,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
  return;
}

Assistant:

void write_variable_assignment(std::ostream &os,
                                       const std::string &variable,
                                       const Expression_node *value)
        {
            os << options.indent << variable << " = " << get_variable_name(value) << ";\n";
        }